

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive_list_column.h
# Opt level: O0

Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
* __thiscall
Gudhi::persistence_matrix::
Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
::multiply_source_and_add
          (Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
           *this,Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
                 *column,Field_element *val)

{
  bool bVar1;
  Field_element *val_local;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  *column_local;
  Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
  *this_local;
  
  if (((*val & 1U) != 0) &&
     (bVar1 = Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
              ::
              _add<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>>
                        ((Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,(Gudhi::persistence_matrix::Column_types)7,false,true,false,true>>>
                          *)this,column), bVar1)) {
    Chain_column_extra_properties<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
    ::swap_pivots(&this->super_Chain_column_option,&column->super_Chain_column_option);
    Column_dimension_holder<Gudhi::persistence_matrix::Matrix<Chain_rep_options<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_true,_false,_true>_>_>
    ::swap_dimension(&this->super_Column_dimension_option,&column->super_Column_dimension_option);
  }
  return this;
}

Assistant:

inline Intrusive_list_column<Master_matrix>& Intrusive_list_column<Master_matrix>::multiply_source_and_add(
    Intrusive_list_column& column,
    const Field_element& val)
{
  if constexpr (Master_matrix::isNonBasic && !Master_matrix::Option_list::is_of_boundary_type) {
    // assumes that the addition never zeros out this column.
    if constexpr (Master_matrix::Option_list::is_z2) {
      if (val) {
        if (_add(column)) {
          Chain_opt::swap_pivots(column);
          Dim_opt::swap_dimension(column);
        }
      }
    } else {
      if (_multiply_source_and_add(column, val)) {
        Chain_opt::swap_pivots(column);
        Dim_opt::swap_dimension(column);
      }
    }
  } else {
    if constexpr (Master_matrix::Option_list::is_z2) {
      if (val) {
        _add(column);
      }
    } else {
      _multiply_source_and_add(column, val);
    }
  }

  return *this;
}